

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

size_t replaceAll(string *str,char *oldValue,string *newValue)

{
  string *psVar1;
  ulong uVar2;
  undefined8 local_38;
  size_t count;
  size_t len;
  size_t pos;
  string *newValue_local;
  char *oldValue_local;
  string *str_local;
  
  psVar1 = (string *)strlen(oldValue);
  local_38 = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::find((char *)str,(ulong)oldValue);
    if (uVar2 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)str,uVar2,psVar1);
    std::__cxx11::string::length();
    local_38 = local_38 + 1;
  }
  return local_38;
}

Assistant:

size_t replaceAll(std::string& str, const char* oldValue,const std::string& newValue)
{
	size_t pos = 0;
	size_t len = strlen(oldValue);

	size_t count = 0;
	while ((pos = str.find(oldValue, pos)) != std::string::npos)
	{
		str.replace(pos,len,newValue);
		pos += newValue.length();
		count++;
	}

	return count;
}